

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O1

Curl_addrinfo * Curl_unix2addr(char *path,_Bool *longpath,_Bool abstract)

{
  Curl_addrinfo *pCVar1;
  size_t sVar2;
  ulong __n;
  void *__dest;
  
  *longpath = false;
  pCVar1 = (Curl_addrinfo *)(*Curl_ccalloc)(1,0x9e);
  if (pCVar1 != (Curl_addrinfo *)0x0) {
    pCVar1->ai_addr = (sockaddr *)(pCVar1 + 1);
    *(undefined2 *)&pCVar1[1].ai_flags = 1;
    sVar2 = strlen(path);
    __n = sVar2 + 1;
    if (__n < 0x6d) {
      pCVar1->ai_family = 1;
      pCVar1->ai_socktype = 1;
      pCVar1->ai_addrlen = (int)sVar2 + 3U & 0x7fffffff;
      if (abstract) {
        __dest = (void *)((long)&pCVar1[1].ai_flags + 3);
        __n = sVar2;
      }
      else {
        __dest = (void *)((long)&pCVar1[1].ai_flags + 2);
      }
      memcpy(__dest,path,__n);
      return pCVar1;
    }
    (*Curl_cfree)(pCVar1);
    *longpath = true;
  }
  return (Curl_addrinfo *)0x0;
}

Assistant:

struct Curl_addrinfo *Curl_unix2addr(const char *path, bool *longpath,
                                     bool abstract)
{
  struct Curl_addrinfo *ai;
  struct sockaddr_un *sa_un;
  size_t path_len;

  *longpath = FALSE;

  ai = calloc(1, sizeof(struct Curl_addrinfo) + sizeof(struct sockaddr_un));
  if(!ai)
    return NULL;
  ai->ai_addr = (void *)((char *)ai + sizeof(struct Curl_addrinfo));

  sa_un = (void *) ai->ai_addr;
  sa_un->sun_family = AF_UNIX;

  /* sun_path must be able to store the NUL-terminated path */
  path_len = strlen(path) + 1;
  if(path_len > sizeof(sa_un->sun_path)) {
    free(ai);
    *longpath = TRUE;
    return NULL;
  }

  ai->ai_family = AF_UNIX;
  ai->ai_socktype = SOCK_STREAM; /* assume reliable transport for HTTP */
  ai->ai_addrlen = (curl_socklen_t)
    ((offsetof(struct sockaddr_un, sun_path) + path_len) & 0x7FFFFFFF);

  /* Abstract Unix domain socket have NULL prefix instead of suffix */
  if(abstract)
    memcpy(sa_un->sun_path + 1, path, path_len - 1);
  else
    memcpy(sa_un->sun_path, path, path_len); /* copy NUL byte */

  return ai;
}